

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Dump
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,uint newLinePerEntry)

{
  code *pcVar1;
  Bucket<AddPropertyCacheBucket> *this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *t;
  uint local_44;
  uint i;
  Bucket<AddPropertyCacheBucket> *bucket;
  Iterator __iter;
  uint _iterHash;
  uint newLinePerEntry_local;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this_local;
  
  __iter.current._0_4_ = 0;
  __iter.current._4_4_ = newLinePerEntry;
  do {
    if (this->tableSize <= (uint)__iter.current) {
      return;
    }
    _bucket = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
              GetIterator(this->table + (uint)__iter.current);
    while( true ) {
      if (__iter.list ==
          (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = bucket;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                          *)this_00,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      t = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
          Data((Iterator *)&bucket);
      Output::Print(L"%4d  =>  ",(ulong)(uint)t->value);
      Dump<AddPropertyCacheBucket>(&t->element);
      for (local_44 = 0; local_44 < __iter.current._4_4_; local_44 = local_44 + 1) {
        Output::Print(L"\n");
      }
    }
    __iter.current._0_4_ = (uint)__iter.current + 1;
  } while( true );
}

Assistant:

inline void
HashTable<T, TAllocator>::Dump(uint newLinePerEntry)
{
    FOREACH_HASHTABLE_ENTRY(T, bucket, this)
    {

        Output::Print(_u("%4d  =>  "), bucket.value);
        ::Dump<T>(bucket.element);
        for (uint i = 0; i < newLinePerEntry; i++)
        {
            Output::Print(_u("\n"));
        }
    }
    NEXT_HASHTABLE_ENTRY;
}